

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O1

int32_t llama_relative_position_bucket
                  (llama_pos x,llama_pos y,uint64_t n_buckets,bool bidirectional)

{
  undefined7 in_register_00000009;
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  
  uVar1 = n_buckets >> (bidirectional & 0x3fU);
  uVar3 = x - y;
  if ((int)CONCAT71(in_register_00000009,bidirectional) == 0) {
    iVar4 = 0;
    uVar2 = -((int)uVar3 >> 0x1f & uVar3);
  }
  else {
    iVar4 = (int)uVar1;
    if ((int)uVar3 < 1) {
      iVar4 = 0;
    }
    uVar2 = -uVar3;
    if (0 < (int)uVar3) {
      uVar2 = uVar3;
    }
  }
  uVar5 = uVar1 >> 1;
  dVar8 = (double)uVar5;
  fVar6 = logf((float)((double)(int)uVar2 / dVar8));
  dVar7 = log(128.0 / dVar8);
  fVar6 = floorf((float)((double)(fVar6 * (float)(uVar1 - uVar5)) / dVar7 + dVar8));
  uVar3 = (int)uVar1 - 1;
  if ((int)fVar6 <= (int)uVar3) {
    uVar3 = (int)fVar6;
  }
  if (uVar2 < uVar5) {
    uVar3 = uVar2;
  }
  return uVar3 + iVar4;
}

Assistant:

static int32_t llama_relative_position_bucket(llama_pos x, llama_pos y, uint64_t n_buckets, bool bidirectional) {
    // TODO move to hparams if a T5 variant appears that uses a different value
    const int64_t max_distance = 128;

    if (bidirectional) {
        n_buckets >>= 1;
    }

    const int64_t max_exact = n_buckets >> 1;

    int32_t relative_position = x - y;
    int32_t relative_bucket = 0;

    if (bidirectional) {
        relative_bucket += (relative_position > 0) * n_buckets;
        relative_position = abs(relative_position);
    } else {
        relative_position = -std::min<int32_t>(relative_position, 0);
    }

    int32_t relative_position_if_large = floorf(max_exact + logf(1.0 * relative_position / max_exact) * (n_buckets - max_exact) / log(1.0 * max_distance / max_exact));
    relative_position_if_large = std::min<int32_t>(relative_position_if_large, n_buckets - 1);
    relative_bucket += (relative_position < max_exact ? relative_position : relative_position_if_large);

    return relative_bucket;
}